

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

void __thiscall METADemuxer::updateReport(METADemuxer *this,bool checkTime)

{
  pointer pSVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  long lVar4;
  ostream *poVar5;
  undefined7 in_register_00000031;
  StreamInfo *si;
  pointer pSVar6;
  long lVar7;
  double dVar8;
  double local_58;
  string local_50;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  if (((int)CONCAT71(in_register_00000031,checkTime) == 0) ||
     (250000000 < lVar3 - (this->m_lastReportTime).__d.__r)) {
    local_58 = 100.0;
    lVar4 = this->m_totalSize;
    if (0 < lVar4) {
      pSVar6 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar1 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar7 = 0;
      if (pSVar6 != pSVar1) {
        do {
          iVar2 = (*(pSVar6->m_streamReader->super_BaseAbstractStreamReader).
                    _vptr_BaseAbstractStreamReader[3])();
          lVar7 = lVar7 + CONCAT44(extraout_var,iVar2);
          pSVar6 = pSVar6 + 1;
        } while (pSVar6 != pSVar1);
        lVar4 = this->m_totalSize;
      }
      dVar8 = ((double)(lVar7 + (this->m_containerReader).m_discardedSize) / (double)lVar4) * 100.0;
      local_58 = 100.0;
      if (dVar8 <= 100.0) {
        local_58 = dVar8;
      }
    }
    if (sLastMsg == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1bM",2);
    }
    sLastMsg = false;
    doubleToStr_abi_cxx11_(&local_50,&local_58,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% complete",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    (this->m_lastReportTime).__d.__r = lVar3;
  }
  return;
}

Assistant:

void METADemuxer::updateReport(const bool checkTime)
{
    const auto currentTime = std::chrono::steady_clock::now();
    if (!checkTime || currentTime - m_lastReportTime > std::chrono::microseconds(250000))
    {
        double progress = 100.0;
        if (m_totalSize > 0)
        {
            const int64_t currentProcessedSize = getDemuxedSize();
            progress = static_cast<double>(currentProcessedSize) / static_cast<double>(m_totalSize) * 100.0;
            if (progress > 100.0)
                progress = 100.0;
        }
        lineBack();
        cout << doubleToStr(progress, 1) << "% complete" << std::endl;
        m_lastReportTime = currentTime;
    }
}